

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitted_normal_matrix.cc
# Opt level: O0

void __thiscall
ipx::SplittedNormalMatrix::Prepare(SplittedNormalMatrix *this,Basis *basis,double *colscale)

{
  BasicStatus BVar1;
  reference pvVar2;
  Basis *pBVar3;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  Int j_3;
  Int p_1;
  Int k_2;
  double d_1;
  Int j_2;
  size_t k_1;
  Int j_1;
  vector<int,_std::allocator<int>_> nonbasic_vars;
  double d;
  Int j;
  Int p;
  Int k;
  SparseMatrix *AI;
  Int n;
  Int m;
  undefined4 in_stack_fffffffffffffe78;
  Int in_stack_fffffffffffffe7c;
  BasicStatus in_stack_fffffffffffffe80;
  Int in_stack_fffffffffffffe84;
  Basis *in_stack_fffffffffffffe88;
  Basis *this_00;
  Basis *in_stack_fffffffffffffe90;
  SparseMatrix *A;
  undefined8 in_stack_fffffffffffffe98;
  pointer *ppiVar4;
  undefined4 in_stack_fffffffffffffea0;
  BasicStatus in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int iVar5;
  Basis *local_110;
  SparseMatrix local_108;
  int local_74;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  int local_4c;
  value_type local_48;
  int local_44;
  SparseMatrix *local_28;
  Int local_20;
  Int local_1c;
  long local_18;
  
  local_18 = in_RDX;
  local_1c = Model::rows((Model *)(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish);
  local_20 = Model::cols((Model *)(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish);
  local_28 = Model::AI((Model *)(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish);
  *(undefined1 *)
   &in_RDI[0x14].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  SparseMatrix::clear((SparseMatrix *)0x84fc43);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x84fc7b);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x84fc91);
  Basis::GetLuFactors(in_stack_fffffffffffffe90,(SparseMatrix *)in_stack_fffffffffffffe88,
                      (SparseMatrix *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      (Int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (Int *)0x84fcad);
  InversePerm(in_RDI);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
  for (local_44 = 0; local_44 < local_1c; local_44 = local_44 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_44);
    local_48 = *pvVar2;
    local_4c = Basis::operator[]((Basis *)CONCAT44(in_stack_fffffffffffffe84,
                                                   in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe7c);
    BVar1 = Basis::StatusOf(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    if (BVar1 == BASIC) {
      local_58 = *(undefined8 *)(local_18 + (long)local_4c * 8);
      ScaleColumn((SparseMatrix *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                  (Int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(double)in_stack_fffffffffffffe90)
      ;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x84fdc5);
  for (local_74 = 0; local_74 < local_20 + local_1c; local_74 = local_74 + 1) {
    in_stack_fffffffffffffea4 = Basis::StatusOf(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84)
    ;
    if (in_stack_fffffffffffffea4 == NONBASIC) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                 (value_type_conflict2 *)in_stack_fffffffffffffe88);
    }
  }
  CopyColumns((SparseMatrix *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
              (vector<int,_std::allocator<int>_> *)
              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  ppiVar4 = &in_RDI[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  A = &local_108;
  SparseMatrix::operator=
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (SparseMatrix *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  SparseMatrix::~SparseMatrix
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  PermuteRows(A,(vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  local_110 = (Basis *)0x0;
  while( true ) {
    this_00 = local_110;
    pBVar3 = (Basis *)std::vector<int,_std::allocator<int>_>::size(&local_70);
    if (pBVar3 <= this_00) break;
    std::vector<int,_std::allocator<int>_>::operator[](&local_70,(size_type)local_110);
    ScaleColumn((SparseMatrix *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                (Int)((ulong)ppiVar4 >> 0x20),(double)A);
    local_110 = (Basis *)((long)&local_110->control_ + 1);
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x84ff67);
  for (iVar5 = 0; iVar5 < local_1c; iVar5 = iVar5 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)
               &in_RDI[0x11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(long)iVar5);
    in_stack_fffffffffffffe84 =
         Basis::operator[]((Basis *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe7c);
    in_stack_fffffffffffffe80 = Basis::StatusOf(this_00,in_stack_fffffffffffffe84);
    if (in_stack_fffffffffffffe80 == BASIC_FREE) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)A,(value_type_conflict2 *)this_00);
    }
  }
  *(undefined1 *)
   &in_RDI[0x14].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)A);
  return;
}

Assistant:

void SplittedNormalMatrix::Prepare(const Basis& basis, const double* colscale) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(colscale);
    prepared_ = false;
    N_.clear();                 // deallocate old memory

    basis.GetLuFactors(&L_, &U_, rowperm_inv_.data(), colperm_.data());
    rowperm_inv_ = InversePerm(rowperm_inv_);

    // Scale columns of U.
    for (Int k = 0; k < m; k++) {
        Int p = colperm_[k];
        Int j = basis[p];
        // Nothing to do for BASIC_FREE variables.
        if (basis.StatusOf(j) == Basis::BASIC) {
            double d = colscale[j];
            assert(std::isfinite(d) && d > 0.0);
            ScaleColumn(U_, k, d);
        }
    }

    // Build N with permuted row indices.
    std::vector<Int> nonbasic_vars;
    for (Int j = 0; j < n+m; j++)
        if (basis.StatusOf(j) == Basis::NONBASIC)
            nonbasic_vars.push_back(j);
    N_ = CopyColumns(AI, nonbasic_vars);
    PermuteRows(N_, rowperm_inv_);

    // Scale columns of N.
    for (size_t k = 0; k < nonbasic_vars.size(); k++) {
        Int j = nonbasic_vars[k];
        double d = colscale[j];
        assert(std::isfinite(d));
        ScaleColumn(N_, (Int)k, d);
    }

    // Build list of free variables.
    free_positions_.clear();
    for (Int k = 0; k < m; k++) {
        Int p = colperm_[k];
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC_FREE)
            free_positions_.push_back(k);
    }
    prepared_ = true;
}